

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O1

void __thiscall icu_63::CollationWeights::initForTertiary(CollationWeights *this)

{
  this->middleLength = 3;
  this->minBytes[1] = 0;
  this->minBytes[2] = 0;
  this->maxBytes[1] = 0;
  this->maxBytes[2] = 0;
  this->minBytes[3] = 2;
  this->minBytes[4] = 2;
  this->maxBytes[3] = 0x3f;
  this->maxBytes[4] = 0x3f;
  return;
}

Assistant:

void
CollationWeights::initForTertiary() {
    // We use only the lower 16 bits for tertiary weights.
    middleLength=3;
    minBytes[1] = 0;
    maxBytes[1] = 0;
    minBytes[2] = 0;
    maxBytes[2] = 0;
    // We use only 6 bits per byte.
    // The other bits are used for case & quaternary weights.
    minBytes[3] = Collation::LEVEL_SEPARATOR_BYTE + 1;
    maxBytes[3] = 0x3f;
    minBytes[4] = 2;
    maxBytes[4] = 0x3f;
}